

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::UniformAssignCase::UniformAssignCase
          (UniformAssignCase *this,Context *context,char *name,char *description,
          CaseShaderType shaderType,
          SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
          *uniformCollection,CheckMethod checkMethod,AssignMethod assignMethod,
          deUint32 additionalFeatures)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000084;
  
  gles31::TestCase::TestCase((TestCase *)this,context,name,glcts::fixed_sample_locations_values + 1)
  ;
  (this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_01e5b120;
  iVar1 = (*context->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(this->super_UniformCase).super_CallLogWrapper,
             (Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
             m_log);
  (this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_01e5b120;
  *(AssignMethod *)&(this->super_UniformCase).super_CallLogWrapper.field_0x14 =
       (uint)(checkMethod == CHECKMETHOD_RENDER) * 2 | assignMethod;
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>::SharedPtr
            (&(this->super_UniformCase).m_uniformCollection,
             (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection> *)
             CONCAT44(in_register_00000084,shaderType));
  (this->super_UniformCase).m_caseShaderType = (CaseShaderType)description;
  (this->super_UniformCase).m_textures2d.
  super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_UniformCase).m_textures2d.
  super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_UniformCase).m_textures2d.
  super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_UniformCase).m_texturesCube.
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_UniformCase).m_texturesCube.
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_UniformCase).m_texturesCube.
  super__Vector_base<glu::TextureCube_*,_std::allocator<glu::TextureCube_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_UniformCase).m_filledTextureUnits.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_UniformCase).m_filledTextureUnits.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_UniformCase).m_filledTextureUnits.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_UniformCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformCase_01e5b458;
  this->m_checkMethod = (CheckMethod)uniformCollection;
  return;
}

Assistant:

UniformAssignCase::UniformAssignCase (Context&									context,
									  const char* const							name,
									  const char* const							description,
									  const CaseShaderType						shaderType,
									  const SharedPtr<const UniformCollection>&	uniformCollection,
									  const CheckMethod							checkMethod,
									  const AssignMethod						assignMethod,
									  const deUint32							additionalFeatures)
	: UniformCase		(context, name, description, shaderType, uniformCollection,
						 (assignMethod == ASSIGNMETHOD_VALUE ? FEATURE_UNIFORMFUNC_VALUE : 0) | additionalFeatures)
	, m_checkMethod		(checkMethod)
{
	DE_ASSERT(assignMethod != ASSIGNMETHOD_LAST);
}